

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sha1.hpp
# Opt level: O1

void websocketpp::sha1::calc(void *src,size_t bytelength,uchar *hash)

{
  ulong uVar1;
  uint uVar2;
  undefined1 auVar3 [32];
  undefined1 auVar4 [32];
  long lVar5;
  uint *puVar6;
  ulong uVar7;
  byte bVar8;
  ulong uVar9;
  uint *unaff_R12;
  undefined1 auVar10 [16];
  undefined1 auVar12 [32];
  undefined1 auVar13 [64];
  undefined1 auVar14 [64];
  undefined1 auVar15 [64];
  undefined1 auVar16 [64];
  undefined1 auVar17 [64];
  undefined1 auVar18 [64];
  undefined1 auVar19 [64];
  undefined1 auVar20 [64];
  undefined1 in_ZMM4 [64];
  undefined1 auVar21 [32];
  undefined1 auVar22 [32];
  undefined1 auVar23 [16];
  uint result [5];
  uint w [80];
  uint local_198 [6];
  ulong local_180;
  uint local_178 [82];
  undefined1 auVar11 [32];
  
  auVar10 = in_ZMM4._0_16_;
  local_198[0] = 0x67452301;
  local_198[1] = 0xefcdab89;
  local_198[2] = 0x98badcfe;
  local_198[3] = 0x10325476;
  local_198[4] = 0xc3d2e1f0;
  local_180 = bytelength;
  if (bytelength < 0x40) {
    uVar9 = 0;
  }
  else {
    unaff_R12 = local_178;
    uVar9 = 0;
    do {
      uVar1 = uVar9 + 0x40;
      puVar6 = unaff_R12;
      do {
        uVar2 = swap_bytes(*(undefined4 *)((long)src + uVar9));
        *puVar6 = uVar2;
        uVar9 = uVar9 + 4;
        puVar6 = puVar6 + 1;
      } while (uVar9 < uVar1);
      anon_unknown_1::innerHash(local_198,unaff_R12);
      auVar10 = in_ZMM4._0_16_;
    } while (uVar9 <= bytelength - 0x40);
  }
  uVar1 = local_180;
  bVar8 = 0;
  local_178[0] = 0;
  local_178[1] = 0;
  local_178[2] = 0;
  local_178[3] = 0;
  local_178[4] = 0;
  local_178[5] = 0;
  local_178[6] = 0;
  local_178[7] = 0;
  local_178[8] = 0;
  local_178[9] = 0;
  local_178[10] = 0;
  local_178[0xb] = 0;
  local_178[0xc] = 0;
  local_178[0xd] = 0;
  local_178[0xe] = 0;
  local_178[0xf] = 0;
  if (local_180 == uVar9) {
    uVar7 = 0;
  }
  else {
    uVar7 = 0;
    do {
      puVar6 = (uint *)((long)local_178 + (uVar7 & 0xfffffffffffffffc));
      *puVar6 = *puVar6 | (uint)*(byte *)((long)src + uVar7 + uVar9) << (~bVar8 & 0x18);
      uVar7 = uVar7 + 1;
      bVar8 = bVar8 + 8;
    } while (local_180 - uVar9 != uVar7);
  }
  puVar6 = (uint *)((long)local_178 + (uVar7 & 0xfffffffffffffffc));
  *puVar6 = *puVar6 | 0x80 << (~((char)uVar7 * '\b') & 0x18U);
  if (0x37 < local_180 - uVar9) {
    anon_unknown_1::innerHash(local_198,local_178);
    local_178[0] = 0;
    local_178[1] = 0;
    local_178[2] = 0;
    local_178[3] = 0;
    local_178[4] = 0;
    local_178[5] = 0;
    local_178[6] = 0;
    local_178[7] = 0;
    local_178[8] = 0;
    local_178[9] = 0;
    local_178[10] = 0;
    local_178[0xb] = 0;
    local_178[0xc] = 0;
    local_178[0xd] = 0;
    local_178[0xe] = 0;
    local_178[0xf] = 0;
  }
  local_178[0xf] = (int)uVar1 << 3;
  auVar16 = ZEXT1664(auVar10);
  anon_unknown_1::innerHash(local_198,local_178);
  auVar3 = vpmovsxbd_avx2(ZEXT816(0xd0e0f1011121314));
  auVar13 = vpmovsxbq_avx512f(ZEXT816(0xd0e0f1011121314));
  lVar5 = 0;
  auVar14 = vpmovsxbq_avx512f(ZEXT816(0x706050403020100));
  auVar15 = vpbroadcastq_avx512f(ZEXT816(0x14));
  auVar16 = vpternlogd_avx512f(auVar16,auVar16,auVar16,0xff);
  auVar17 = vpbroadcastq_avx512f(ZEXT816(0x3fffffff));
  auVar21._8_4_ = 0x18;
  auVar21._0_8_ = 0x1800000018;
  auVar21._12_4_ = 0x18;
  auVar21._16_4_ = 0x18;
  auVar21._20_4_ = 0x18;
  auVar21._24_4_ = 0x18;
  auVar21._28_4_ = 0x18;
  auVar18 = vpbroadcastq_avx512f(ZEXT816(0xfffffffffffffff8));
  auVar22._8_4_ = 0xfffffff8;
  auVar22._0_8_ = 0xfffffff8fffffff8;
  auVar22._12_4_ = 0xfffffff8;
  auVar22._16_4_ = 0xfffffff8;
  auVar22._20_4_ = 0xfffffff8;
  auVar22._24_4_ = 0xfffffff8;
  auVar22._28_4_ = 0xfffffff8;
  do {
    auVar19 = vpbroadcastq_avx512f();
    auVar19 = vporq_avx512f(auVar19,auVar14);
    uVar9 = vpcmpuq_avx512f(auVar19,auVar15,1);
    auVar19 = vpaddq_avx512f(auVar13,auVar16);
    auVar20 = vpsrlq_avx512f(auVar19,2);
    vpandq_avx512f(auVar20,auVar17);
    auVar4 = vpmovm2d_avx512vl(uVar9);
    auVar11 = vpgatherqd_avx512f(*(undefined8 *)(local_198 + (long)unaff_R12));
    auVar12._4_4_ = (uint)((byte)(uVar9 >> 1) & 1) * auVar11._4_4_;
    auVar12._0_4_ = (uint)((byte)uVar9 & 1) * auVar11._0_4_;
    auVar12._8_4_ = (uint)((byte)(uVar9 >> 2) & 1) * auVar11._8_4_;
    auVar12._12_4_ = (uint)((byte)(uVar9 >> 3) & 1) * auVar11._12_4_;
    auVar12._16_4_ = (uint)((byte)(uVar9 >> 4) & 1) * auVar11._16_4_;
    auVar12._20_4_ = (uint)((byte)(uVar9 >> 5) & 1) * auVar11._20_4_;
    auVar12._24_4_ = (uint)((byte)(uVar9 >> 6) & 1) * auVar11._24_4_;
    auVar12._28_4_ = (uint)(byte)(uVar9 >> 7) * auVar11._28_4_;
    auVar11 = vpsubd_avx2(SUB6432(ZEXT1664((undefined1  [16])0x0),0),auVar3);
    auVar11 = vpslld_avx2(auVar11,3);
    auVar11 = vpand_avx2(auVar11,auVar21);
    auVar11 = vpsrlvd_avx2(auVar12,auVar11);
    auVar10 = vpmovdb_avx512vl(auVar11);
    auVar23._8_8_ = 0;
    auVar23._0_8_ = auVar10._0_8_;
    auVar10 = vpshufb_avx(auVar23,ZEXT816(0x1020304050607));
    auVar11 = vpshufd_avx2(auVar4,0x1b);
    auVar11 = vpermq_avx2(auVar11,0x4e);
    vpmovd2m_avx512vl(auVar11);
    auVar10 = vmovdqu8_avx512vl(auVar10);
    *(undefined1 (*) [16])(hash + auVar19._0_8_ + -7) = auVar10;
    lVar5 = lVar5 + 8;
    auVar13 = vpaddq_avx512f(auVar13,auVar18);
    auVar3 = vpaddd_avx2(auVar22,auVar3);
  } while (lVar5 != 0x18);
  return;
}

Assistant:

inline void calc(void const * src, size_t bytelength, unsigned char * hash) {
    // Init the result array.
    unsigned int result[5] = { 0x67452301, 0xefcdab89, 0x98badcfe,
                               0x10325476, 0xc3d2e1f0 };

    // Cast the void src pointer to be the byte array we can work with.
    unsigned char const * sarray = (unsigned char const *) src;

    // The reusable round buffer
    unsigned int w[80];

    // Loop through all complete 64byte blocks.

    size_t endCurrentBlock;
    size_t currentBlock = 0;

    if (bytelength >= 64) {
        size_t const endOfFullBlocks = bytelength - 64;

        while (currentBlock <= endOfFullBlocks) {
            endCurrentBlock = currentBlock + 64;

            // Init the round buffer with the 64 byte block data.
            for (int roundPos = 0; currentBlock < endCurrentBlock; currentBlock += 4)
            {
                // This line will swap endian on big endian and keep endian on
                // little endian.
                w[roundPos++] = (unsigned int) sarray[currentBlock + 3]
                        | (((unsigned int) sarray[currentBlock + 2]) << 8)
                        | (((unsigned int) sarray[currentBlock + 1]) << 16)
                        | (((unsigned int) sarray[currentBlock]) << 24);
            }
            innerHash(result, w);
        }
    }

    // Handle the last and not full 64 byte block if existing.
    endCurrentBlock = bytelength - currentBlock;
    clearWBuffert(w);
    size_t lastBlockBytes = 0;
    for (;lastBlockBytes < endCurrentBlock; ++lastBlockBytes) {
        w[lastBlockBytes >> 2] |= (unsigned int) sarray[lastBlockBytes + currentBlock] << ((3 - (lastBlockBytes & 3)) << 3);
    }

    w[lastBlockBytes >> 2] |= 0x80 << ((3 - (lastBlockBytes & 3)) << 3);
    if (endCurrentBlock >= 56) {
        innerHash(result, w);
        clearWBuffert(w);
    }
    w[15] = bytelength << 3;
    innerHash(result, w);

    // Store hash in result pointer, and make sure we get in in the correct
    // order on both endian models.
    for (int hashByte = 20; --hashByte >= 0;) {
        hash[hashByte] = (result[hashByte >> 2] >> (((3 - hashByte) & 0x3) << 3)) & 0xff;
    }
}